

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

shared_ptr<kratos::Property> __thiscall
kratos::Generator::property
          (Generator *this,string *property_name,shared_ptr<kratos::Sequence> *sequence)

{
  bool bVar1;
  UserException *this_00;
  remove_reference_t<std::__cxx11::basic_string<char>_&> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Property>_>_>,_bool>
  pVar2;
  shared_ptr<kratos::Property> sVar3;
  string_view format_str;
  format_args args;
  string local_e8;
  _Self local_c8;
  _Self local_c0 [2];
  shared_ptr<kratos::Sequence> *sequence_local;
  string *property_name_local;
  Generator *this_local;
  shared_ptr<kratos::Property> *prop;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_90;
  basic_string_view<char> local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  shared_ptr<kratos::Sequence> *local_48;
  char *local_40;
  string *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  sequence_local = sequence;
  property_name_local = property_name;
  this_local = this;
  local_c0[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Property>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Property>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Property>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Property>_>_>_>
               *)((long)&property_name[0x25].field_2 + 8),(key_type *)sequence);
  local_c8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Property>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Property>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Property>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Property>_>_>_>
              *)((long)&property_name[0x25].field_2 + 8));
  bVar1 = std::operator!=(local_c0,&local_c8);
  if (bVar1) {
    this_00 = (UserException *)__cxa_allocate_exception(0x10);
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&property_name[3].field_2 + 8);
    local_38 = &local_e8;
    local_40 = "Property {0} already exists in {1}";
    local_48 = sequence_local;
    fmt::v7::make_args_checked<std::__cxx11::string_const&,std::__cxx11::string&,char[35],char>
              (&local_78,(v7 *)"Property {0} already exists in {1}",(char (*) [35])sequence_local,
               (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)vargs,in_R8);
    local_58 = &local_78;
    local_88 = fmt::v7::to_string_view<char,_0>(local_40);
    local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&prop;
    local_30 = local_58;
    local_20 = local_58;
    local_10 = local_58;
    local_18 = local_28;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0xdd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_58);
    format_str.size_ = (size_t)prop;
    format_str.data_ = (char *)local_88.size_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_90.values_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_e8,(detail *)local_88.data_,format_str,args);
    UserException::UserException(this_00,&local_e8);
    __cxa_throw(this_00,&UserException::typeinfo,UserException::~UserException);
  }
  std::
  make_shared<kratos::Property,std::__cxx11::string_const&,std::shared_ptr<kratos::Sequence>const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             sequence_local);
  pVar2 = std::
          map<std::__cxx11::string,std::shared_ptr<kratos::Property>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Property>>>>
          ::emplace<std::__cxx11::string_const&,std::shared_ptr<kratos::Property>&>
                    ((map<std::__cxx11::string,std::shared_ptr<kratos::Property>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Property>>>>
                      *)(property_name[0x25].field_2._M_local_buf + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     sequence_local,(shared_ptr<kratos::Property> *)this);
  sVar3.super___shared_ptr<kratos::Property,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       pVar2._8_8_;
  sVar3.super___shared_ptr<kratos::Property,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<kratos::Property>)
         sVar3.super___shared_ptr<kratos::Property,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Property> Generator::property(const std::string &property_name,
                                              const std::shared_ptr<Sequence> &sequence) {
    if (properties_.find(property_name) != properties_.end())
        throw UserException(::format("Property {0} already exists in {1}", property_name, name));
    auto prop = std::make_shared<Property>(property_name, sequence);
    properties_.emplace(property_name, prop);
    return prop;
}